

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O2

uint32_t immutable::rrb_details::find_shift<int,false,6>
                   (ref<immutable::rrb_details::tree_node<int,_false>_> *node)

{
  uint32_t uVar1;
  tree_node<int,_false> *ptVar2;
  ref<immutable::rrb_details::tree_node<int,_false>_> child;
  ref<immutable::rrb_details::tree_node<int,_false>_> local_10;
  
  ptVar2 = ref<immutable::rrb_details::tree_node<int,_false>_>::operator->(node);
  if (ptVar2->type == LEAF_NODE) {
    uVar1 = 0;
  }
  else {
    local_10.ptr = (tree_node<int,_false> *)**(long **)&node->ptr[1]._ref_count;
    if (local_10.ptr != (tree_node<int,_false> *)0x0) {
      (local_10.ptr)->_ref_count = (local_10.ptr)->_ref_count + 1;
    }
    uVar1 = find_shift<int,false,6>(&local_10);
    uVar1 = uVar1 + 6;
    ref<immutable::rrb_details::tree_node<int,_false>_>::~ref(&local_10);
  }
  return uVar1;
}

Assistant:

uint32_t find_shift(const ref<tree_node<T, atomic_ref_counting>>& node)
      {
      if (node->type == LEAF_NODE)
        {
        return 0;
        }
      else
        { // must be internal node
        internal_node<T, atomic_ref_counting>* inode = (internal_node<T, atomic_ref_counting>*)node.ptr;
        ref<tree_node<T, atomic_ref_counting>> child = inode->child[0];
        return bits<N>::rrb_bits + find_shift<T, atomic_ref_counting, N>(child);
        }
      }